

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * TEST_cargo_zero_start_bool_option(void)

{
  int iVar1;
  uint uVar2;
  char *local_38;
  char *args [1];
  cargo_t pcStack_28;
  int b;
  cargo_t cargo;
  char *pcStack_18;
  int ret;
  char *msg;
  
  pcStack_18 = (char *)0x0;
  cargo._4_4_ = 0;
  iVar1 = cargo_init(&stack0xffffffffffffffd8,0,"program");
  if (iVar1 == 0) {
    args[0]._4_4_ = 0;
    local_38 = "--beta";
    uVar2 = cargo_add_option(pcStack_28,0,"--beta",(char *)0x0,"b",(long)args + 4);
    cargo._4_4_ = uVar2 | cargo._4_4_;
    if (cargo._4_4_ == 0) {
      cargo._4_4_ = cargo_parse(pcStack_28,0,0,1,&local_38);
      if (cargo._4_4_ == 0) {
        if (args[0]._4_4_ != 1) {
          pcStack_18 = "Expected b == 1";
        }
      }
      else {
        pcStack_18 = "Parse failed";
      }
    }
    else {
      pcStack_18 = "Failed to add option";
    }
    cargo_destroy(&stack0xffffffffffffffd8);
    msg = pcStack_18;
  }
  else {
    msg = "Failed to init cargo";
  }
  return msg;
}

Assistant:

_TEST_START(TEST_cargo_zero_start_bool_option)
{
    int b = 0;
    char *args[] = { "--beta" };

    ret |= cargo_add_option(cargo, 0, "--beta", NULL, "b", &b);
    cargo_assert(ret == 0, "Failed to add option");

    ret = cargo_parse(cargo, 0, 0, sizeof(args) / sizeof(args[0]), args);
    cargo_assert(ret == 0, "Parse failed");
    cargo_assert(b == 1, "Expected b == 1");

    _TEST_CLEANUP();
}